

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status __thiscall
google::protobuf::(anonymous_namespace)::Error<char_const*>(_anonymous_namespace_ *this,char *args)

{
  AlphaNum *a;
  AlphaNum local_78;
  string local_48;
  undefined1 local_28 [16];
  char *local_18;
  char *args_local;
  
  local_18 = args;
  args_local = (char *)this;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_78,args);
  absl::lts_20240722::StrCat_abi_cxx11_(&local_48,(lts_20240722 *)&local_78,a);
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  absl::lts_20240722::FailedPreconditionError(this,local_28._0_8_,local_28._8_8_);
  std::__cxx11::string::~string((string *)&local_48);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}